

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::Limits::test_max_transform_feedback_separate_attribs(Limits *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLint max_transform_feedback_separate_attribs;
  Functions *gl;
  Limits *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x868))(0x8c8b,&local_24);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x8bb);
  bVar1 = 3 < local_24;
  if (!bVar1) {
    this_00 = deqp::Context::getTestContext(this->m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [56])"GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is equal to ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_24);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [30])" which is less than expected ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,&s_min_value_of_max_transform_feedback_separate_attribs);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return bVar1;
}

Assistant:

bool gl3cts::TransformFeedback::Limits::test_max_transform_feedback_separate_attribs(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check that MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is at least 4. */
	glw::GLint max_transform_feedback_separate_attribs = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &max_transform_feedback_separate_attribs);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_transform_feedback_separate_attribs < s_min_value_of_max_transform_feedback_separate_attribs)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS is equal to "
			<< max_transform_feedback_separate_attribs << " which is less than expected "
			<< s_min_value_of_max_transform_feedback_separate_attribs << "." << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}